

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O2

response * __thiscall
warhawk::common::webclient::execute(response *__return_storage_ptr__,webclient *this,request *req_)

{
  void *pvVar1;
  cookie_list *pcVar2;
  response *this_00;
  response *prVar3;
  webclient *pwVar4;
  request *prVar5;
  int iVar6;
  long lVar7;
  _Base_ptr p_Var8;
  runtime_error *this_01;
  char *__rhs;
  allocator<char> local_111;
  response *local_110;
  curl_slist *info;
  webclient *local_100;
  request *local_f8;
  unique_ptr<curl_slist,_void_(*)(curl_slist_*)> cleanup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  
  lVar7 = 0;
  local_110 = __return_storage_ptr__;
  local_100 = this;
  local_f8 = req_;
  for (p_Var8 = (req_->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pwVar4 = local_100,
      (_Rb_tree_header *)p_Var8 != &(req_->m_headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                   ,":");
    std::operator+(&str,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 2)
                  );
    std::__cxx11::string::~string((string *)&local_e0);
    lVar7 = curl_slist_append(lVar7,str._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&str);
  }
  curl_easy_setopt(local_100->m_curl,0x2727,lVar7);
  pcVar2 = &local_f8->m_cookies;
  for (p_Var8 = (local_f8->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; prVar5 = local_f8,
      (_Rb_tree_header *)p_Var8 != &(pcVar2->m_cookies)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    pvVar1 = pwVar4->m_curl;
    cookie::to_string_abi_cxx11_(&str,(cookie *)(p_Var8 + 1));
    curl_easy_setopt(pvVar1,0x2797,str._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&str);
  }
  if ((local_f8->m_method)._M_string_length != 0) {
    curl_easy_setopt(pwVar4->m_curl,0x2734,(local_f8->m_method)._M_dataplus._M_p);
  }
  this_00 = local_110;
  if ((prVar5->m_data)._M_string_length != 0) {
    curl_easy_setopt(pwVar4->m_curl,0x3c);
    curl_easy_setopt(pwVar4->m_curl,0x271f,(prVar5->m_data)._M_dataplus._M_p);
  }
  curl_easy_setopt(pwVar4->m_curl,0x2712,(prVar5->m_url)._M_dataplus._M_p);
  curl_easy_setopt(pwVar4->m_curl,0x34,prVar5->m_follow_redirect);
  response::response(this_00);
  curl_easy_setopt(pwVar4->m_curl,0x4e2b,string_write_cb);
  curl_easy_setopt(pwVar4->m_curl,0x2711,this_00);
  curl_easy_setopt(pwVar4->m_curl,0x4e6f,multimap_header_cb);
  curl_easy_setopt(pwVar4->m_curl,0x272d,&this_00->m_headers);
  iVar6 = curl_easy_perform(pwVar4->m_curl);
  if (lVar7 != 0) {
    curl_slist_free_all(lVar7);
  }
  if (iVar6 == 0) {
    curl_easy_getinfo(pwVar4->m_curl,0x40001c,&info);
    cleanup._M_t.super___uniq_ptr_impl<curl_slist,_void_(*)(curl_slist_*)>._M_t.
    super__Tuple_impl<0UL,_curl_slist_*,_void_(*)(curl_slist_*)>.
    super__Tuple_impl<1UL,_void_(*)(curl_slist_*)>.
    super__Head_base<1UL,_void_(*)(curl_slist_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(curl_slist_*),_false>)curl_slist_free_all;
    cleanup._M_t.super___uniq_ptr_impl<curl_slist,_void_(*)(curl_slist_*)>._M_t.
    super__Tuple_impl<0UL,_curl_slist_*,_void_(*)(curl_slist_*)>.
    super__Head_base<0UL,_curl_slist_*,_false>._M_head_impl = info;
    for (; prVar3 = local_110, info != (curl_slist *)0x0; info = info->next) {
      if (info->data != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,info->data,&local_111);
        cookie::parse((cookie *)&str,&local_e0);
        std::
        _Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
        ::_M_insert_unique<warhawk::common::cookie>
                  ((_Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
                    *)&this_00->m_cookies,(cookie *)&str);
        cookie::~cookie((cookie *)&str);
        std::__cxx11::string::~string((string *)&local_e0);
      }
    }
    curl_easy_getinfo(local_100->m_curl,0x200002,&local_110->m_status_code);
    std::unique_ptr<curl_slist,_void_(*)(curl_slist_*)>::~unique_ptr(&cleanup);
    return prVar3;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Failed to execute curl request:",(allocator<char> *)&cleanup);
  __rhs = (char *)curl_easy_strerror(iVar6);
  std::operator+(&str,&local_e0,__rhs);
  std::runtime_error::runtime_error(this_01,(string *)&str);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

response webclient::execute( const request &req_ )
{
  struct curl_slist* headers = nullptr;

  for ( auto &e : req_.m_headers )
  {
    auto str = e.first + ":" + e.second;
    headers = curl_slist_append( headers, str.c_str( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_HTTPHEADER, headers );

  for ( auto &c : req_.m_cookies.m_cookies )
  {
    curl_easy_setopt( m_curl, CURLOPT_COOKIELIST, c.to_string( ).c_str( ) );
  }

  if ( !req_.m_method.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_CUSTOMREQUEST, req_.m_method.c_str( ) );
  }

  if ( !req_.m_data.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDSIZE, req_.m_data.size( ) );
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDS,    req_.m_data.data( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_URL,            req_.m_url.c_str( )            );
  curl_easy_setopt( m_curl, CURLOPT_FOLLOWLOCATION, req_.m_follow_redirect ? 1 : 0 );

  response resp;

  curl_easy_setopt( m_curl, CURLOPT_WRITEFUNCTION,  string_write_cb    );
  curl_easy_setopt( m_curl, CURLOPT_WRITEDATA,     &resp.m_data        );
  curl_easy_setopt( m_curl, CURLOPT_HEADERFUNCTION, multimap_header_cb );
  curl_easy_setopt( m_curl, CURLOPT_HEADERDATA,    &resp.m_headers     );

  auto res = curl_easy_perform( m_curl );

  if ( headers != NULL )
  {
    curl_slist_free_all( headers );
  }

  if ( res == CURLE_OK )
  {
    struct curl_slist *info;
    res = curl_easy_getinfo( m_curl, CURLINFO_COOKIELIST, &info );
    std::unique_ptr< struct curl_slist, decltype( &curl_slist_free_all ) > cleanup( info, &curl_slist_free_all );

    while ( info != nullptr )
    {
      if ( info->data != nullptr )
      {
        resp.m_cookies.m_cookies.insert( cookie::parse( info->data ) );
      }

      info = info->next;
    }

    curl_easy_getinfo( m_curl, CURLINFO_RESPONSE_CODE, &resp.m_status_code );

    return resp;
  }
  else
  {
    throw std::runtime_error( std::string( "Failed to execute curl request:" ) + curl_easy_strerror( res ) );
  }
}